

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O0

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::initiate_async_accept::operator()
          (initiate_async_accept *this,function<void_(const_std::error_code_&)> *handler,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,endpoint_type *peer_endpoint)

{
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> *in_RDI;
  any_io_executor *in_stack_00000020;
  function<void_(const_std::error_code_&)> *in_stack_00000028;
  endpoint_type *in_stack_00000030;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_00000038;
  implementation_type *in_stack_00000040;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff78;
  
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&)>_&>::non_const_lvalue
            (in_RDI,in_stack_ffffffffffffff78);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_service(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_implementation(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                       **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  get_executor(*(io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>
                 **)&(in_RDI->value).super__Function_base._M_functor);
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,std::function<void(std::error_code_const&)>,asio::any_io_executor>
            ((reactive_socket_service<asio::ip::tcp> *)
             handler2.value.super__Function_base._M_functor._M_unused._0_8_,in_stack_00000040,
             in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  asio::detail::non_const_lvalue<std::function<void_(const_std::error_code_&)>_&>::~non_const_lvalue
            ((non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> *)0x700f77);
  return;
}

Assistant:

void operator()(AcceptHandler&& handler,
        basic_socket<Protocol1, Executor1>* peer,
        endpoint_type* peer_endpoint) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a AcceptHandler.
      ASIO_ACCEPT_HANDLER_CHECK(AcceptHandler, handler) type_check;

      detail::non_const_lvalue<AcceptHandler> handler2(handler);
      self_->impl_.get_service().async_accept(
          self_->impl_.get_implementation(), *peer, peer_endpoint,
          handler2.value, self_->impl_.get_executor());
    }